

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O3

void print_result(int f,float res,v_array<char> tag,float lb,float ub)

{
  size_t sVar1;
  ulong uVar2;
  int *piVar3;
  char *__s;
  char temp [30];
  stringstream ss;
  char local_1e8;
  undefined7 uStack_1e7;
  ulong local_1e0;
  undefined1 local_1d8 [16];
  char local_1c8 [32];
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  if (-1 < f) {
    sprintf(local_1c8,"%f",SUB84((double)res,0));
    std::__cxx11::stringstream::stringstream(local_1a8);
    sVar1 = strlen(local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,local_1c8,sVar1);
    print_tag((stringstream *)local_1a8,tag);
    local_1e8 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1e8,1);
    sprintf(local_1c8,"%f",SUB84((double)lb,0));
    sVar1 = strlen(local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,local_1c8,sVar1);
    local_1e8 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1e8,1);
    sprintf(local_1c8,"%f",SUB84((double)ub,0));
    sVar1 = strlen(local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,local_1c8,sVar1);
    local_1e8 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1e8,1);
    std::__cxx11::stringbuf::str();
    if ((undefined1 *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1e7,local_1e8));
    }
    std::__cxx11::stringbuf::str();
    uVar2 = io_buf::write_file_or_socket
                      (f,(void *)CONCAT71(uStack_1e7,local_1e8),local_1e0 & 0xffffffff);
    if ((undefined1 *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1e7,local_1e8));
    }
    if (uVar2 != local_1e0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"write error: ",0xd);
      piVar3 = __errno_location();
      __s = strerror(*piVar3);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2d7a38);
      }
      else {
        sVar1 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar1);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  return;
}

Assistant:

void print_result(int f, float res, v_array<char> tag, float lb, float ub)
{
  if (f >= 0)
  {
    char temp[30];
    sprintf(temp, "%f", res);
    std::stringstream ss;
    ss << temp;
    print_tag(ss, tag);
    ss << ' ';
    sprintf(temp, "%f", lb);
    ss << temp;
    ss << ' ';
    sprintf(temp, "%f", ub);
    ss << temp;
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}